

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateMachinePattern.cpp
# Opt level: O2

void __thiscall State1::executeStateTask(State1 *this)

{
  element_type *peVar1;
  Status *this_00;
  int iVar2;
  size_t sVar3;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar1 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"State 1 was here",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)peVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = (this->super_State).spStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"STM: Executing state 1",&local_39);
  Status::setStatusMessage(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  do {
    iVar2 = rand();
    sVar3 = (size_t)(iVar2 % 4 + 1);
    peVar1 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while (peVar1->nPreviousRandomNumber == sVar3);
  peVar1->nPreviousRandomNumber = sVar3;
  std::__shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_State).spNextState.super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_State).spPossibleNextStates.
              super__Vector_base<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar3 - 1].
              super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void State1::executeStateTask()
{
    spData->vGuestBook.push_back( "State 1 was here" );
    spStatus->setStatusMessage("STM: Executing state 1");
    
    size_t nRsandNum = ( rand() % 4 ) + 1;
    
    while(spData->nPreviousRandomNumber == nRsandNum )
    {
        nRsandNum = ( rand() % 4 ) + 1;
    }
     
    spData->nPreviousRandomNumber = nRsandNum;

    spNextState = spPossibleNextStates[nRsandNum-1];
}